

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

bool dlib::string_cast_helper<bool>::cast<char,std::char_traits<char>,std::allocator<char>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  undefined8 uVar4;
  ulong in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  string local_a0 [8];
  string *in_stack_ffffffffffffff68;
  string_cast_error *in_stack_ffffffffffffff70;
  string local_80 [48];
  string local_50 [32];
  string local_30 [32];
  ulong local_10;
  bool local_1;
  
  local_10 = in_RDI;
  lVar2 = std::__cxx11::string::size();
  if ((lVar2 == 1) && (pcVar3 = (char *)std::__cxx11::string::operator[](local_10), *pcVar3 == '1'))
  {
    return true;
  }
  lVar2 = std::__cxx11::string::size();
  if ((lVar2 == 1) && (pcVar3 = (char *)std::__cxx11::string::operator[](local_10), *pcVar3 == '0'))
  {
    return false;
  }
  narrow<char,std::char_traits<char>,std::allocator<char>>(in_stack_ffffffffffffff08);
  tolower<std::char_traits<char>,std::allocator<char>>(in_stack_ffffffffffffff48);
  bVar1 = std::operator==(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  if (bVar1) {
    local_1 = true;
  }
  else {
    narrow<char,std::char_traits<char>,std::allocator<char>>(in_stack_ffffffffffffff08);
    tolower<std::char_traits<char>,std::allocator<char>>(in_stack_ffffffffffffff48);
    bVar1 = std::operator==(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_a0);
    if (!bVar1) {
      uVar4 = __cxa_allocate_exception(0x30);
      narrow<char,std::char_traits<char>,std::allocator<char>>(in_stack_ffffffffffffff08);
      string_cast_error::string_cast_error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      __cxa_throw(uVar4,&string_cast_error::typeinfo,string_cast_error::~string_cast_error);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool cast (
            const std::basic_string<charT,traits,alloc>& str
        )
        {
            using namespace std;
            if (str.size() == 1 && str[0] == '1')
                return true;
            if (str.size() == 1 && str[0] == '0')
                return false;
            if (tolower(narrow(str)) == "true")
                return true;
            if (tolower(narrow(str)) == "false")
                return false;

            throw string_cast_error(narrow(str));
        }